

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_segment_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::AqSegmentTest_TestNoMisMatchExtDeltaQ_Test::
~AqSegmentTest_TestNoMisMatchExtDeltaQ_Test(AqSegmentTest_TestNoMisMatchExtDeltaQ_Test *this)

{
  anon_unknown.dwarf_128a39f::AqSegmentTest::~AqSegmentTest((AqSegmentTest *)(this + -0x18));
  operator_delete((AqSegmentTest *)(this + -0x18));
  return;
}

Assistant:

TEST_P(AqSegmentTest, TestNoMisMatchExtDeltaQ) {
  cfg_.rc_end_usage = AOM_CQ;
  aq_mode_ = 0;
  deltaq_mode_ = 2;
  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 15);

  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}